

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaUtils.cpp
# Opt level: O1

int nv::cuda::getFastestDevice(void)

{
  return -1;
}

Assistant:

int nv::cuda::getFastestDevice()
{
	int max_gflops_device = -1;
#if defined HAVE_CUDA
	int max_gflops = 0;

	const int device_count = deviceCount();
	for (int i = 0; i < device_count; i++)
	{
		if (isValidDevice(i))
		{
			cudaDeviceProp device_properties;
			cudaGetDeviceProperties(&device_properties, i);
			int gflops = device_properties.multiProcessorCount * device_properties.clockRate;

			if (gflops > max_gflops)
			{
				max_gflops = gflops;
				max_gflops_device = i;
			}
		}
	}
#endif
	return max_gflops_device;
}